

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<char_const(&)[8],unsigned_int&,char_const(&)[5],char_const(&)[2],unsigned_int&,char_const(&)[3]>
          (string *__return_storage_ptr__,spirv_cross *this,char (*ts) [8],uint *ts_1,
          char (*ts_2) [5],char (*ts_3) [2],uint *ts_4,char (*ts_5) [3])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  uint *ts_local_4;
  char (*ts_local_3) [2];
  char (*ts_local_2) [5];
  uint *ts_local_1;
  char (*ts_local) [8];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[8],unsigned_int&,char_const(&)[5],char_const(&)[2],unsigned_int&,char_const(&)[3]>
            ((StringStream<4096UL,_4096UL> *)local_1128,(char (*) [8])this,(uint *)ts,
             (char (*) [5])ts_1,(char (*) [2])ts_2,
             (uint *)stream.saved_buffers.stack_storage.aligned_char._184_8_,(char (*) [3])ts_4);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1128);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}